

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O2

ostream * Kernel::operator<<(ostream *out,Formula *f)

{
  ostream *poVar1;
  string local_30;
  
  Formula::toString_abi_cxx11_(&local_30,f);
  poVar1 = std::operator<<(out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& out, const Formula* f)
{
  return out << f->toString();
}